

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void generate_code(CompiledCommand *ccmd,CodeGenerator *codegen)

{
  pointer pvVar1;
  undefined8 in_RAX;
  unsigned_short *puVar2;
  variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
  *arg;
  pointer varg;
  optional<uint16_t> opcode;
  ulong local_28;
  
  local_28._3_5_ = (undefined5)((ulong)in_RAX >> 0x18);
  local_28._0_3_ = (uint3)((ushort)in_RAX & 0xff00);
  if ((Command *)codegen->oatc != (Command *)0x0) {
    CustomHeaderOATC::find_opcode
              ((CustomHeaderOATC *)((long)&local_28 + 4),(Command *)codegen->oatc);
    std::experimental::optional<unsigned_short>::operator=
              ((optional<unsigned_short> *)&local_28,
               (optional<unsigned_short> *)((long)&local_28 + 4));
    if ((local_28 & 1) != 0) goto LAB_0018377d;
  }
  std::experimental::optional<unsigned_short>::operator=
            ((optional<unsigned_short> *)&local_28,&ccmd->command->id);
LAB_0018377d:
  if (((byte)local_28 & 1) != 0) {
    puVar2 = std::experimental::optional<unsigned_short>::operator*
                       ((optional<unsigned_short> *)&local_28);
    BinaryWriter::emplace_u16(&codegen->bw,(ushort)(*(int *)ccmd << 0xf) | *puVar2);
    pvVar1 = (ccmd->args).
             super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (varg = (ccmd->args).
                super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
                ._M_impl.super__Vector_impl_data._M_start; varg != pvVar1; varg = varg + 1) {
      generate_code(varg,codegen);
    }
    return;
  }
  ProgramContext::fatal_error<tag_nocontext_t,std::__cxx11::string_const&>
            (codegen->program,(tag_nocontext_t *)&nocontext,
             "could not compile command {}, no id or no hash [-moatc]",&ccmd->command->name);
}

Assistant:

inline void generate_code(const CompiledCommand& ccmd, CodeGenerator& codegen)
{
    optional<uint16_t> opcode;

    if(codegen.oatc)
        opcode = codegen.oatc->find_opcode(ccmd.command);

    if(opcode == nullopt)
        opcode = ccmd.command.id;

    if(opcode == nullopt)
        codegen.program.fatal_error(nocontext, "could not compile command {}, no id or no hash [-moatc]", ccmd.command.name);

    codegen.bw.emplace_u16(*opcode | (ccmd.not_flag? 0x8000 : 0x0000));
    for(auto& arg : ccmd.args) ::generate_code(arg, codegen);
}